

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_avx2.c
# Opt level: O2

void trans_store_16x16_lpf_vert14(uchar *in0,int in_p,uchar *out,int out_p,int is_store_avx2)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  long lVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  
  lVar4 = (long)in_p;
  auVar6._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(in0 + lVar4 * 9) +
       ZEXT116(1) * *(undefined1 (*) [16])(in0 + lVar4);
  auVar6._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(in0 + lVar4 * 9);
  auVar7._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(in0 + lVar4 * 10) +
       ZEXT116(1) * *(undefined1 (*) [16])(in0 + lVar4 * 2);
  auVar7._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(in0 + lVar4 * 10);
  auVar8._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(in0 + lVar4 * 0xb) +
       ZEXT116(1) * *(undefined1 (*) [16])(in0 + lVar4 * 3);
  auVar8._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(in0 + lVar4 * 0xb);
  auVar9._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(in0 + lVar4 * 0xc) +
       ZEXT116(1) * *(undefined1 (*) [16])(in0 + lVar4 * 4);
  auVar9._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(in0 + lVar4 * 0xc);
  auVar10._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(in0 + lVar4 * 0xd) +
       ZEXT116(1) * *(undefined1 (*) [16])(in0 + lVar4 * 5);
  auVar10._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(in0 + lVar4 * 0xd);
  auVar5._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(in0 + lVar4 * 8) + ZEXT116(1) * *(undefined1 (*) [16])in0
  ;
  auVar5._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(in0 + lVar4 * 8);
  auVar11._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(in0 + lVar4 * 0xe) +
       ZEXT116(1) * *(undefined1 (*) [16])(in0 + lVar4 * 6);
  auVar11._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(in0 + lVar4 * 0xe);
  auVar12._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(in0 + lVar4 * 0xf) +
       ZEXT116(1) * *(undefined1 (*) [16])(in0 + lVar4 * 7);
  auVar12._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(in0 + lVar4 * 0xf);
  auVar1 = vpunpcklbw_avx2(auVar5,auVar6);
  auVar5 = vpunpckhbw_avx2(auVar5,auVar6);
  auVar2 = vpunpcklbw_avx2(auVar7,auVar8);
  auVar6 = vpunpckhbw_avx2(auVar7,auVar8);
  auVar3 = vpunpcklbw_avx2(auVar9,auVar10);
  auVar7 = vpunpckhbw_avx2(auVar9,auVar10);
  auVar9 = vpunpcklbw_avx2(auVar11,auVar12);
  auVar8 = vpunpckhbw_avx2(auVar11,auVar12);
  auVar10 = vpunpcklwd_avx2(auVar1,auVar2);
  auVar1 = vpunpckhwd_avx2(auVar1,auVar2);
  auVar2 = vpunpcklwd_avx2(auVar5,auVar6);
  auVar5 = vpunpckhwd_avx2(auVar5,auVar6);
  auVar11 = vpunpcklwd_avx2(auVar3,auVar9);
  auVar6 = vpunpckhwd_avx2(auVar3,auVar9);
  auVar3 = vpunpcklwd_avx2(auVar7,auVar8);
  auVar7 = vpunpckhwd_avx2(auVar7,auVar8);
  auVar8 = vpunpckldq_avx2(auVar10,auVar11);
  auVar9 = vpermq_avx2(auVar8,0xd8);
  auVar8 = vpunpckhdq_avx2(auVar10,auVar11);
  auVar10 = vpermq_avx2(auVar8,0xd8);
  auVar8 = vpunpckldq_avx2(auVar1,auVar6);
  auVar8 = vpermq_avx2(auVar8,0xd8);
  auVar6 = vpunpckhdq_avx2(auVar1,auVar6);
  auVar1 = vpermq_avx2(auVar6,0xd8);
  auVar6 = vpunpckldq_avx2(auVar2,auVar3);
  auVar11 = vpermq_avx2(auVar6,0xd8);
  auVar6 = vpunpckhdq_avx2(auVar2,auVar3);
  auVar2 = vpermq_avx2(auVar6,0xd8);
  auVar6 = vpunpckldq_avx2(auVar5,auVar7);
  auVar6 = vpermq_avx2(auVar6,0xd8);
  auVar5 = vpunpckhdq_avx2(auVar5,auVar7);
  auVar5 = vpermq_avx2(auVar5,0xd8);
  if (is_store_avx2 == 0) {
    *(undefined1 (*) [16])out = auVar9._0_16_;
    lVar4 = (long)out_p;
    *(undefined1 (*) [16])(out + lVar4 * 2) = auVar10._0_16_;
    *(undefined1 (*) [16])(out + lVar4 * 4) = auVar8._0_16_;
    *(undefined1 (*) [16])(out + lVar4 * 6) = auVar1._0_16_;
    *(undefined1 (*) [16])(out + lVar4 * 8) = auVar11._0_16_;
    *(undefined1 (*) [16])(out + lVar4 * 10) = auVar2._0_16_;
    *(undefined1 (*) [16])(out + lVar4 * 0xc) = auVar6._0_16_;
    *(undefined1 (*) [16])(out + lVar4 * 0xe) = auVar5._0_16_;
    *(undefined1 (*) [16])(out + lVar4) = auVar9._16_16_;
    *(undefined1 (*) [16])(out + lVar4 * 3) = auVar10._16_16_;
    *(undefined1 (*) [16])(out + lVar4 * 5) = auVar8._16_16_;
    *(undefined1 (*) [16])(out + lVar4 * 7) = auVar1._16_16_;
    *(undefined1 (*) [16])(out + lVar4 * 9) = auVar11._16_16_;
    *(undefined1 (*) [16])(out + lVar4 * 0xb) = auVar2._16_16_;
    *(undefined1 (*) [16])(out + lVar4 * 0xd) = auVar6._16_16_;
    *(undefined1 (*) [16])(out + lVar4 * 0xf) = auVar5._16_16_;
    return;
  }
  *(undefined1 (*) [32])out = auVar9;
  lVar4 = (long)out_p;
  *(undefined1 (*) [32])(out + lVar4 * 2) = auVar10;
  *(undefined1 (*) [32])(out + lVar4 * 4) = auVar8;
  *(undefined1 (*) [32])(out + lVar4 * 6) = auVar1;
  *(undefined1 (*) [32])(out + lVar4 * 8) = auVar11;
  *(undefined1 (*) [32])(out + lVar4 * 10) = auVar2;
  *(undefined1 (*) [32])(out + lVar4 * 0xc) = auVar6;
  *(undefined1 (*) [32])(out + lVar4 * 0xe) = auVar5;
  return;
}

Assistant:

static inline void trans_store_16x16_lpf_vert14(unsigned char *in0, int in_p,
                                                unsigned char *out, int out_p,
                                                int is_store_avx2) {
  const __m128i x0 = _mm_loadu_si128((__m128i *)in0);
  const __m128i x1 = _mm_loadu_si128((__m128i *)(in0 + in_p * 1));
  const __m128i x2 = _mm_loadu_si128((__m128i *)(in0 + in_p * 2));
  const __m128i x3 = _mm_loadu_si128((__m128i *)(in0 + in_p * 3));
  const __m128i x4 = _mm_loadu_si128((__m128i *)(in0 + in_p * 4));
  const __m128i x5 = _mm_loadu_si128((__m128i *)(in0 + in_p * 5));
  const __m128i x6 = _mm_loadu_si128((__m128i *)(in0 + in_p * 6));
  const __m128i x7 = _mm_loadu_si128((__m128i *)(in0 + in_p * 7));

  const __m256i y0 = _mm256_insertf128_si256(
      _mm256_castsi128_si256(x0), _mm_loadu_si128((__m128i *)(in0 + in_p * 8)),
      0x1);
  const __m256i y1 = _mm256_insertf128_si256(
      _mm256_castsi128_si256(x1), _mm_loadu_si128((__m128i *)(in0 + in_p * 9)),
      0x1);
  const __m256i y2 = _mm256_insertf128_si256(
      _mm256_castsi128_si256(x2), _mm_loadu_si128((__m128i *)(in0 + in_p * 10)),
      0x1);
  const __m256i y3 = _mm256_insertf128_si256(
      _mm256_castsi128_si256(x3), _mm_loadu_si128((__m128i *)(in0 + in_p * 11)),
      0x1);
  const __m256i y4 = _mm256_insertf128_si256(
      _mm256_castsi128_si256(x4), _mm_loadu_si128((__m128i *)(in0 + in_p * 12)),
      0x1);
  const __m256i y5 = _mm256_insertf128_si256(
      _mm256_castsi128_si256(x5), _mm_loadu_si128((__m128i *)(in0 + in_p * 13)),
      0x1);
  const __m256i y6 = _mm256_insertf128_si256(
      _mm256_castsi128_si256(x6), _mm_loadu_si128((__m128i *)(in0 + in_p * 14)),
      0x1);
  const __m256i y7 = _mm256_insertf128_si256(
      _mm256_castsi128_si256(x7), _mm_loadu_si128((__m128i *)(in0 + in_p * 15)),
      0x1);

  const __m256i y_s00 = _mm256_unpacklo_epi8(y0, y1);
  const __m256i y_s01 = _mm256_unpackhi_epi8(y0, y1);
  const __m256i y_s02 = _mm256_unpacklo_epi8(y2, y3);
  const __m256i y_s03 = _mm256_unpackhi_epi8(y2, y3);
  const __m256i y_s04 = _mm256_unpacklo_epi8(y4, y5);
  const __m256i y_s05 = _mm256_unpackhi_epi8(y4, y5);
  const __m256i y_s06 = _mm256_unpacklo_epi8(y6, y7);
  const __m256i y_s07 = _mm256_unpackhi_epi8(y6, y7);

  const __m256i y_s10 = _mm256_unpacklo_epi16(y_s00, y_s02);
  const __m256i y_s11 = _mm256_unpackhi_epi16(y_s00, y_s02);
  const __m256i y_s12 = _mm256_unpacklo_epi16(y_s01, y_s03);
  const __m256i y_s13 = _mm256_unpackhi_epi16(y_s01, y_s03);
  const __m256i y_s14 = _mm256_unpacklo_epi16(y_s04, y_s06);
  const __m256i y_s15 = _mm256_unpackhi_epi16(y_s04, y_s06);
  const __m256i y_s16 = _mm256_unpacklo_epi16(y_s05, y_s07);
  const __m256i y_s17 = _mm256_unpackhi_epi16(y_s05, y_s07);

  const __m256i y_s20 = _mm256_unpacklo_epi32(y_s10, y_s14);
  const __m256i y_s21 = _mm256_unpackhi_epi32(y_s10, y_s14);
  const __m256i y_s22 = _mm256_unpacklo_epi32(y_s11, y_s15);
  const __m256i y_s23 = _mm256_unpackhi_epi32(y_s11, y_s15);
  const __m256i y_s24 = _mm256_unpacklo_epi32(y_s12, y_s16);
  const __m256i y_s25 = _mm256_unpackhi_epi32(y_s12, y_s16);
  const __m256i y_s26 = _mm256_unpacklo_epi32(y_s13, y_s17);
  const __m256i y_s27 = _mm256_unpackhi_epi32(y_s13, y_s17);

  const __m256i row_s01 = _mm256_permute4x64_epi64(y_s20, 0xd8);
  const __m256i row_s23 = _mm256_permute4x64_epi64(y_s21, 0xd8);
  const __m256i row_s45 = _mm256_permute4x64_epi64(y_s22, 0xd8);
  const __m256i row_s67 = _mm256_permute4x64_epi64(y_s23, 0xd8);
  const __m256i row_s89 = _mm256_permute4x64_epi64(y_s24, 0xd8);
  const __m256i row_s1011 = _mm256_permute4x64_epi64(y_s25, 0xd8);
  const __m256i row_s1213 = _mm256_permute4x64_epi64(y_s26, 0xd8);
  const __m256i row_s1415 = _mm256_permute4x64_epi64(y_s27, 0xd8);

  if (is_store_avx2) {
    _mm256_storeu_si256((__m256i *)(out), row_s01);
    _mm256_storeu_si256((__m256i *)(out + (2 * out_p)), row_s23);
    _mm256_storeu_si256((__m256i *)(out + (4 * out_p)), row_s45);
    _mm256_storeu_si256((__m256i *)(out + (6 * out_p)), row_s67);
    _mm256_storeu_si256((__m256i *)(out + (8 * out_p)), row_s89);
    _mm256_storeu_si256((__m256i *)(out + (10 * out_p)), row_s1011);
    _mm256_storeu_si256((__m256i *)(out + (12 * out_p)), row_s1213);
    _mm256_storeu_si256((__m256i *)(out + (14 * out_p)), row_s1415);
  } else {
    _mm_storeu_si128((__m128i *)(out), _mm256_castsi256_si128(row_s01));
    _mm_storeu_si128((__m128i *)(out + (2 * out_p)),
                     _mm256_castsi256_si128(row_s23));
    _mm_storeu_si128((__m128i *)(out + (4 * out_p)),
                     _mm256_castsi256_si128(row_s45));
    _mm_storeu_si128((__m128i *)(out + (6 * out_p)),
                     _mm256_castsi256_si128(row_s67));
    _mm_storeu_si128((__m128i *)(out + (8 * out_p)),
                     _mm256_castsi256_si128(row_s89));
    _mm_storeu_si128((__m128i *)(out + (10 * out_p)),
                     _mm256_castsi256_si128(row_s1011));
    _mm_storeu_si128((__m128i *)(out + (12 * out_p)),
                     _mm256_castsi256_si128(row_s1213));
    _mm_storeu_si128((__m128i *)(out + (14 * out_p)),
                     _mm256_castsi256_si128(row_s1415));
    _mm_storeu_si128((__m128i *)(out + (1 * out_p)),
                     _mm256_extracti128_si256(row_s01, 1));
    _mm_storeu_si128((__m128i *)(out + (3 * out_p)),
                     _mm256_extracti128_si256(row_s23, 1));
    _mm_storeu_si128((__m128i *)(out + (5 * out_p)),
                     _mm256_extracti128_si256(row_s45, 1));
    _mm_storeu_si128((__m128i *)(out + (7 * out_p)),
                     _mm256_extracti128_si256(row_s67, 1));
    _mm_storeu_si128((__m128i *)(out + (9 * out_p)),
                     _mm256_extracti128_si256(row_s89, 1));
    _mm_storeu_si128((__m128i *)(out + (11 * out_p)),
                     _mm256_extracti128_si256(row_s1011, 1));
    _mm_storeu_si128((__m128i *)(out + (13 * out_p)),
                     _mm256_extracti128_si256(row_s1213, 1));
    _mm_storeu_si128((__m128i *)(out + (15 * out_p)),
                     _mm256_extracti128_si256(row_s1415, 1));
  }
}